

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

void __thiscall DynamicHistogram<double>::add_(DynamicHistogram<double> *this,double value)

{
  pointer pdVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  
  if ((this->_binMax != value) || (NAN(this->_binMax) || NAN(value))) {
    dVar4 = floor((value - this->_binMin) / this->_binWidth);
    iVar2 = (int)dVar4;
  }
  else {
    iVar2 = this->_binCount + -1;
  }
  uVar3 = (ulong)iVar2;
  pdVar1 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->_frequencies).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3)) {
    pdVar1[uVar3] = pdVar1[uVar3] + 1.0;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void
    add_(double const value)
    {
        this->_frequencies.at(this->index_(value))++;
    }